

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_ecdsa_adaptor_encrypt
              (secp256k1_context *ctx,uchar *adaptor_sig162,uchar *seckey32,secp256k1_pubkey *enckey
              ,uchar *msg32,secp256k1_nonce_function_hardened_ecdsa_adaptor noncefp,void *ndata)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  code *pcVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uchar p1_33 [33];
  secp256k1_scalar k;
  secp256k1_scalar dleq_proof_e;
  secp256k1_scalar dleq_proof_s;
  uchar nonce32 [32];
  uchar buf33 [33];
  secp256k1_scalar n;
  secp256k1_scalar sp;
  uchar sk32 [32];
  uchar p2_33 [33];
  secp256k1_ge r;
  secp256k1_ge enckey_ge;
  secp256k1_ge rp;
  secp256k1_scalar msg;
  secp256k1_gej p1j;
  secp256k1_scalar sigr;
  secp256k1_gej rpj;
  secp256k1_gej rj;
  size_t local_598;
  secp256k1_nonce_function_hardened_ecdsa_adaptor local_590;
  uchar *local_588;
  uchar *local_580;
  size_t local_578 [6];
  undefined1 local_548 [16];
  undefined1 local_538 [16];
  undefined1 local_528 [16];
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  size_t local_4e0;
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  secp256k1_scalar local_4b8;
  uchar local_498 [48];
  secp256k1_scalar local_468;
  secp256k1_ge local_438;
  uchar local_3d8 [32];
  uchar local_3b8 [40];
  secp256k1_ge local_390;
  secp256k1_ge local_338;
  secp256k1_ge local_2e0;
  secp256k1_gej local_288;
  secp256k1_gej local_208;
  secp256k1_ge local_188;
  secp256k1_gej local_130;
  secp256k1_gej local_b0;
  
  local_4c8 = (undefined1  [16])0x0;
  local_4d8 = (undefined1  [16])0x0;
  if ((ctx->ecmult_gen_ctx).prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
    secp256k1_ecdsa_adaptor_encrypt_cold_1();
    uVar3 = 0;
  }
  else {
    local_518 = (undefined1  [16])0x0;
    local_528 = (undefined1  [16])0x0;
    local_508 = (undefined1  [16])0x0;
    local_4f8 = (undefined1  [16])0x0;
    pcVar10 = nonce_function_ecdsa_adaptor;
    if (noncefp != (secp256k1_nonce_function_hardened_ecdsa_adaptor)0x0) {
      pcVar10 = noncefp;
    }
    uVar2 = secp256k1_pubkey_load(ctx,&local_338,enckey);
    uVar3 = secp256k1_eckey_pubkey_serialize(&local_338,local_498,&local_4e0,1);
    uVar3 = uVar3 & uVar2;
    local_590 = pcVar10;
    local_588 = seckey32;
    local_580 = msg32;
    iVar4 = (*pcVar10)(local_4d8,msg32,seckey32,local_498,"ECDSAadaptor/non",0x10,ndata);
    uVar2 = 0;
    secp256k1_scalar_set_b32(&local_4b8,local_4d8,(int *)0x0);
    if (iVar4 == 0) {
      uVar3 = 0;
    }
    if (((local_4b8.d[1] == 0 && local_4b8.d[0] == 0) && local_4b8.d[2] == 0) && local_4b8.d[3] == 0
       ) {
      uVar3 = uVar2;
    }
    uVar1 = (ulong)(uVar3 ^ 1) - 1;
    local_4b8.d[0] = local_4b8.d[0] & uVar1 | (ulong)(uVar3 ^ 1);
    local_4b8.d[1] = local_4b8.d[1] & uVar1;
    local_4b8.d[2] = local_4b8.d[2] & uVar1;
    local_4b8.d[3] = uVar1 & local_4b8.d[3];
    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&local_130,&local_4b8);
    secp256k1_ge_set_gej(&local_2e0,&local_130);
    secp256k1_ecmult_const(&local_b0,&local_338,&local_4b8,0x100);
    secp256k1_ge_set_gej(&local_390,&local_b0);
    local_538 = (undefined1  [16])0x0;
    local_548 = (undefined1  [16])0x0;
    secp256k1_scalar_get_b32(local_3d8,&local_4b8);
    iVar4 = secp256k1_eckey_pubkey_serialize(&local_338,(uchar *)&local_468,&local_598,1);
    uVar9 = 0;
    if (iVar4 != 0) {
      iVar4 = secp256k1_eckey_pubkey_serialize(&local_2e0,(uchar *)local_578,&local_598,1);
      uVar9 = 0;
      if (iVar4 != 0) {
        iVar4 = secp256k1_eckey_pubkey_serialize(&local_390,local_3b8,&local_598,1);
        uVar9 = 0;
        if (iVar4 != 0) {
          local_208.x.n[0] = 0xbb67ae856a09e667;
          local_208.x.n[1] = 0xa54ff53a3c6ef372;
          local_208.x.n[2] = 0x9b05688c510e527f;
          local_208.x.n[3] = 0x5be0cd191f83d9ab;
          local_208.z.n[2] = 0;
          secp256k1_sha256_write((secp256k1_sha256 *)&local_208,(uchar *)local_578,0x21);
          secp256k1_sha256_write((secp256k1_sha256 *)&local_208,local_3b8,0x21);
          secp256k1_sha256_finalize((secp256k1_sha256 *)&local_208,(uchar *)&local_288);
          iVar4 = (*local_590)((uchar *)&local_438,(uchar *)&local_288,local_3d8,(uchar *)&local_468
                               ,"DLEQ",4,ndata);
          if (iVar4 == 0) {
            uVar9 = 0;
          }
          else {
            secp256k1_scalar_set_b32((secp256k1_scalar *)local_548,(uchar *)&local_438,(int *)0x0);
            auVar12._0_4_ = -(uint)(local_548._0_4_ == 0 && local_538._0_4_ == 0);
            auVar12._4_4_ = -(uint)(local_548._4_4_ == 0 && local_538._4_4_ == 0);
            auVar12._8_4_ = -(uint)(local_548._8_4_ == 0 && local_538._8_4_ == 0);
            auVar12._12_4_ = -(uint)(local_548._12_4_ == 0 && local_538._12_4_ == 0);
            iVar4 = movmskps(extraout_EAX,auVar12);
            uVar9 = (uint)(iVar4 != 0xf);
          }
          secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&local_208,(secp256k1_scalar *)local_548);
          secp256k1_ge_set_gej(&local_438,&local_208);
          secp256k1_ecmult_const(&local_288,&local_338,(secp256k1_scalar *)local_548,0x100);
          secp256k1_ge_set_gej(&local_188,&local_288);
          secp256k1_dleq_challenge
                    ((secp256k1_scalar *)local_528,&local_338,&local_438,&local_188,&local_2e0,
                     &local_390);
          secp256k1_scalar_mul
                    ((secp256k1_scalar *)local_508,(secp256k1_scalar *)local_528,&local_4b8);
          secp256k1_scalar_add
                    ((secp256k1_scalar *)local_508,(secp256k1_scalar *)local_508,
                     (secp256k1_scalar *)local_548);
        }
      }
    }
    secp256k1_scalar_set_b32((secp256k1_scalar *)&local_208,local_588,(int *)&local_288);
    if ((local_208.x.n[2] == 0 && local_208.x.n[3] == 0) &&
        (local_208.x.n[1] == 0 && local_208.x.n[0] == 0)) {
      uVar9 = uVar2;
    }
    if ((int)local_288.x.n[0] != 0) {
      uVar9 = uVar2;
    }
    uVar8 = (ulong)(uVar9 & uVar3 ^ 1);
    uVar1 = uVar8 - 1;
    local_208.x.n[0] = local_208.x.n[0] & uVar1 | uVar8;
    local_208.x.n[1] = local_208.x.n[1] & uVar1;
    local_208.x.n[2] = local_208.x.n[2] & uVar1;
    local_208.x.n[3] = uVar1 & local_208.x.n[3];
    secp256k1_scalar_set_b32((secp256k1_scalar *)&local_288,local_580,(int *)0x0);
    secp256k1_fe_normalize(&local_390.x);
    secp256k1_fe_get_b32(local_498,&local_390.x);
    secp256k1_scalar_set_b32((secp256k1_scalar *)&local_188,local_498,(int *)0x0);
    auVar13._0_4_ = -(uint)((int)local_188.x.n[2] == 0 && (int)local_188.x.n[0] == 0);
    auVar13._4_4_ = -(uint)(local_188.x.n[2]._4_4_ == 0 && local_188.x.n[0]._4_4_ == 0);
    auVar13._8_4_ = -(uint)((int)local_188.x.n[3] == 0 && (int)local_188.x.n[1] == 0);
    auVar13._12_4_ = -(uint)(local_188.x.n[3]._4_4_ == 0 && local_188.x.n[1]._4_4_ == 0);
    iVar4 = movmskps(extraout_EAX_00,auVar13);
    secp256k1_scalar_mul(&local_468,(secp256k1_scalar *)&local_188,(secp256k1_scalar *)&local_208);
    secp256k1_scalar_add(&local_468,&local_468,(secp256k1_scalar *)&local_288);
    secp256k1_scalar_inverse((secp256k1_scalar *)&local_438,&local_4b8);
    secp256k1_scalar_mul((secp256k1_scalar *)&local_438,(secp256k1_scalar *)&local_438,&local_468);
    auVar11._0_4_ = -(uint)((int)local_438.x.n[2] == 0 && (int)local_438.x.n[0] == 0);
    auVar11._4_4_ = -(uint)(local_438.x.n[2]._4_4_ == 0 && local_438.x.n[0]._4_4_ == 0);
    auVar11._8_4_ = -(uint)((int)local_438.x.n[3] == 0 && (int)local_438.x.n[1] == 0);
    auVar11._12_4_ = -(uint)(local_438.x.n[3]._4_4_ == 0 && local_438.x.n[1]._4_4_ == 0);
    iVar5 = movmskps(extraout_EAX_01,auVar11);
    iVar6 = secp256k1_eckey_pubkey_serialize(&local_390,adaptor_sig162,local_578,1);
    if (iVar6 == 0) {
      uVar2 = 0;
    }
    else {
      iVar6 = secp256k1_eckey_pubkey_serialize(&local_2e0,adaptor_sig162 + 0x21,local_578,1);
      uVar2 = 0;
      if (iVar6 != 0) {
        secp256k1_scalar_get_b32(adaptor_sig162 + 0x42,(secp256k1_scalar *)&local_438);
        secp256k1_scalar_get_b32(adaptor_sig162 + 0x62,(secp256k1_scalar *)local_528);
        secp256k1_scalar_get_b32(adaptor_sig162 + 0x82,(secp256k1_scalar *)local_508);
        uVar2 = 1;
      }
    }
    uVar3 = uVar2 & uVar9 & uVar3 & ~(uint)(iVar5 == 0xf || iVar4 == 0xf);
    lVar7 = 0;
    do {
      adaptor_sig162[lVar7] = adaptor_sig162[lVar7] & ((byte)uVar3 ^ 1) - 1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0xa2);
  }
  return uVar3;
}

Assistant:

int secp256k1_ecdsa_adaptor_encrypt(const secp256k1_context* ctx, unsigned char *adaptor_sig162, unsigned char *seckey32, const secp256k1_pubkey *enckey, const unsigned char *msg32, secp256k1_nonce_function_hardened_ecdsa_adaptor noncefp, void *ndata) {
    secp256k1_scalar k;
    secp256k1_gej rj, rpj;
    secp256k1_ge r, rp;
    secp256k1_ge enckey_ge;
    secp256k1_scalar dleq_proof_s;
    secp256k1_scalar dleq_proof_e;
    secp256k1_scalar sk;
    secp256k1_scalar msg;
    secp256k1_scalar sp;
    secp256k1_scalar sigr;
    secp256k1_scalar n;
    unsigned char nonce32[32] = { 0 };
    unsigned char buf33[33];
    size_t size = 33;
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(adaptor_sig162 != NULL);
    ARG_CHECK(seckey32 != NULL);
    ARG_CHECK(enckey != NULL);
    ARG_CHECK(msg32 != NULL);

    secp256k1_scalar_clear(&dleq_proof_e);
    secp256k1_scalar_clear(&dleq_proof_s);

    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_ecdsa_adaptor;
    }

    ret &= secp256k1_pubkey_load(ctx, &enckey_ge, enckey);
    ret &= secp256k1_eckey_pubkey_serialize(&enckey_ge, buf33, &size, 1);
    ret &= !!noncefp(nonce32, msg32, seckey32, buf33, ecdsa_adaptor_algo, sizeof(ecdsa_adaptor_algo), ndata);
    secp256k1_scalar_set_b32(&k, nonce32, NULL);
    ret &= !secp256k1_scalar_is_zero(&k);
    secp256k1_scalar_cmov(&k, &secp256k1_scalar_one, !ret);

    /* R' := k*G */
    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &rpj, &k);
    secp256k1_ge_set_gej(&rp, &rpj);
    /* R = k*Y; */
    secp256k1_ecmult_const(&rj, &enckey_ge, &k, 256);
    secp256k1_ge_set_gej(&r, &rj);
    /* We declassify the non-secret values rp and r to allow using them
     * as branch points. */
    secp256k1_declassify(ctx, &rp, sizeof(rp));
    secp256k1_declassify(ctx, &r, sizeof(r));

    /* dleq_proof = DLEQ_prove(k, (R', Y, R)) */
    ret &= secp256k1_dleq_prove(ctx, &dleq_proof_s, &dleq_proof_e, &k, &enckey_ge, &rp, &r, noncefp, ndata);

    ret &= secp256k1_scalar_set_b32_seckey(&sk, seckey32);
    secp256k1_scalar_cmov(&sk, &secp256k1_scalar_one, !ret);
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    secp256k1_fe_normalize(&r.x);
    secp256k1_fe_get_b32(buf33, &r.x);
    secp256k1_scalar_set_b32(&sigr, buf33, NULL);
    ret &= !secp256k1_scalar_is_zero(&sigr);
    /* s' = k⁻¹(m + R.x * x) */
    secp256k1_scalar_mul(&n, &sigr, &sk);
    secp256k1_scalar_add(&n, &n, &msg);
    secp256k1_scalar_inverse(&sp, &k);
    secp256k1_scalar_mul(&sp, &sp, &n);
    ret &= !secp256k1_scalar_is_zero(&sp);

    /* return (R, R', s', dleq_proof) */
    ret &= secp256k1_ecdsa_adaptor_sig_serialize(adaptor_sig162, &r, &rp, &sp, &dleq_proof_e, &dleq_proof_s);

    secp256k1_memczero(adaptor_sig162, 162, !ret);
    secp256k1_scalar_clear(&n);
    secp256k1_scalar_clear(&k);
    secp256k1_scalar_clear(&sk);

    return ret;
}